

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  ParameterValueAssignmentSyntax *node;
  ConfigUseClauseSyntax *pCVar1;
  Token TVar2;
  ConfigCellIdentifierSyntax **unaff_retaddr;
  Token *in_stack_00000008;
  BumpAllocator *in_stack_00000010;
  BumpAllocator *in_stack_000000e8;
  Token *in_stack_000000f0;
  BumpAllocator *in_stack_ffffffffffffff98;
  ConfigCellIdentifierSyntax *in_stack_ffffffffffffffa0;
  Token *args_4;
  
  TVar2 = parsing::Token::deepClone(in_stack_000000f0,in_stack_000000e8);
  args_4 = (Token *)TVar2.info;
  if (*(ParameterValueAssignmentSyntax **)((long)__fn + 0x28) ==
      (ParameterValueAssignmentSyntax *)0x0) {
    node = (ParameterValueAssignmentSyntax *)0x0;
  }
  else {
    node = (ParameterValueAssignmentSyntax *)
           deepClone<slang::syntax::ConfigCellIdentifierSyntax>
                     (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  }
  if (*(ParameterValueAssignmentSyntax **)((long)__fn + 0x30) !=
      (ParameterValueAssignmentSyntax *)0x0) {
    deepClone<slang::syntax::ParameterValueAssignmentSyntax>(node,in_stack_ffffffffffffff98);
  }
  parsing::Token::deepClone(in_stack_000000f0,in_stack_000000e8);
  parsing::Token::deepClone(in_stack_000000f0,in_stack_000000e8);
  pCVar1 = BumpAllocator::
           emplace<slang::syntax::ConfigUseClauseSyntax,slang::parsing::Token,slang::syntax::ConfigCellIdentifierSyntax*,slang::syntax::ParameterValueAssignmentSyntax*,slang::parsing::Token,slang::parsing::Token>
                     (in_stack_00000010,in_stack_00000008,unaff_retaddr,
                      (ParameterValueAssignmentSyntax **)__fn,(Token *)__child_stack,args_4);
  return (int)pCVar1;
}

Assistant:

static SyntaxNode* clone(const ConfigUseClauseSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ConfigUseClauseSyntax>(
        node.use.deepClone(alloc),
        node.name ? deepClone(*node.name, alloc) : nullptr,
        node.paramAssignments ? deepClone(*node.paramAssignments, alloc) : nullptr,
        node.colon.deepClone(alloc),
        node.config.deepClone(alloc)
    );
}